

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFile_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamFile::Open(BamFile *this,OpenMode mode)

{
  char *pcVar1;
  FILE *pFVar2;
  ulong uVar3;
  int in_ESI;
  long *in_RDI;
  string message;
  string message_base;
  allocator local_109;
  string local_108 [38];
  byte local_e2;
  allocator local_e1;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  int local_14;
  byte local_1;
  
  local_14 = in_ESI;
  (**(code **)(*in_RDI + 0x10))();
  if (local_14 == 1) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen64(pcVar1,"rb");
    in_RDI[6] = (long)pFVar2;
  }
  else if (local_14 == 2) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen64(pcVar1,"wb");
    in_RDI[6] = (long)pFVar2;
  }
  else {
    if (local_14 != 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"BamFile::Open",&local_39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"unknown open mode requested",&local_71);
      IBamIODevice::SetErrorString
                ((IBamIODevice *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 in_stack_ffffffffffffff20);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      local_1 = 0;
      goto LAB_001df421;
    }
    pcVar1 = (char *)std::__cxx11::string::c_str();
    pFVar2 = fopen64(pcVar1,"w+b");
    in_RDI[6] = (long)pFVar2;
  }
  if (in_RDI[6] == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"could not open file handle for ",&local_99);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    uVar3 = std::__cxx11::string::empty();
    local_e2 = 0;
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff20,(string *)(in_RDI + 7));
    }
    else {
      std::allocator<char>::allocator();
      local_e2 = 1;
      std::__cxx11::string::string((string *)&stack0xffffffffffffff20,"empty filename",&local_e1);
    }
    std::operator+(&local_c0,&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff20);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    if ((local_e2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"BamFile::Open",&local_109);
    IBamIODevice::SetErrorString
              ((IBamIODevice *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    local_1 = 0;
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    *(int *)(in_RDI + 1) = local_14;
    local_1 = 1;
  }
LAB_001df421:
  return (bool)(local_1 & 1);
}

Assistant:

bool BamFile::Open(const IBamIODevice::OpenMode mode)
{

    // make sure we're starting with a fresh file stream
    Close();

    // attempt to open FILE* depending on requested openmode
    if (mode == IBamIODevice::ReadOnly)
        m_stream = fopen(m_filename.c_str(), "rb");
    else if (mode == IBamIODevice::WriteOnly)
        m_stream = fopen(m_filename.c_str(), "wb");
    else if (mode == IBamIODevice::ReadWrite)
        m_stream = fopen(m_filename.c_str(), "w+b");
    else {
        SetErrorString("BamFile::Open", "unknown open mode requested");
        return false;
    }

    // check that we obtained a valid FILE*
    if (m_stream == 0) {
        const std::string message_base = std::string("could not open file handle for ");
        const std::string message =
            message_base + ((m_filename.empty()) ? "empty filename" : m_filename);
        SetErrorString("BamFile::Open", message);
        return false;
    }

    // store current IO mode & return success
    m_mode = mode;
    return true;
}